

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

int __thiscall
deqp::gls::BufferTestUtil::BufferMapVerifier::verify
          (BufferMapVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  GLenum GVar2;
  deBool dVar3;
  deUint8 *resPtr;
  TestError *this_00;
  undefined8 extraout_RAX;
  GLenum target;
  bool isOk;
  deUint8 *mapPtr;
  deUint32 target_local;
  int numBytes_local;
  int offset_local;
  deUint8 *reference_local;
  deUint32 buffer_local;
  BufferMapVerifier *this_local;
  
  target = (GLenum)tbslen;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,target,(GLuint)ctx);
  resPtr = (deUint8 *)
           glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_BufferVerifierBase).super_CallLogWrapper,target,
                      (long)(int)siglen,(long)(int)tbs,1);
  GVar2 = glu::CallLogWrapper::glGetError(&(this->super_BufferVerifierBase).super_CallLogWrapper);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                  ,0x192);
  while( true ) {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (resPtr == (deUint8 *)0x0)) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      bVar1 = compareByteArrays((this->super_BufferVerifierBase).m_log,resPtr,sig + (int)siglen,
                                (int)tbs);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferVerifierBase).super_CallLogWrapper,target);
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_BufferVerifierBase).super_CallLogWrapper);
      glu::checkError(GVar2,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                      ,0x198);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_BufferVerifierBase).super_CallLogWrapper,target,0);
      return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1);
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
             ,0x193);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool BufferMapVerifier::verify (deUint32 buffer, const deUint8* reference, int offset, int numBytes, deUint32 target)
{
	const deUint8*	mapPtr		= DE_NULL;
	bool			isOk		= false;

	glBindBuffer(target, buffer);
	mapPtr = (const deUint8*)glMapBufferRange(target, offset, numBytes, GL_MAP_READ_BIT);
	GLU_CHECK_MSG("glMapBufferRange");
	TCU_CHECK(mapPtr);

	isOk = compareByteArrays(m_log, mapPtr, reference+offset, numBytes);

	glUnmapBuffer(target);
	GLU_CHECK_MSG("glUnmapBuffer");

	glBindBuffer(target, 0);

	return isOk;
}